

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputFile.cpp
# Opt level: O0

void __thiscall OutputFile::OutputFile(OutputFile *this,string *name_arg,string *version_arg)

{
  allocator<char> local_2e;
  allocator<char> local_2d [13];
  string *local_20;
  string *version_arg_local;
  string *name_arg_local;
  OutputFile *this_local;
  
  local_20 = version_arg;
  version_arg_local = name_arg;
  name_arg_local = (string *)this;
  std::__cxx11::list<OutputFile_*,_std::allocator<OutputFile_*>_>::list(&this->descendants);
  std::__cxx11::string::string((string *)&this->name,(string *)version_arg_local);
  std::__cxx11::string::string((string *)&this->version,(string *)local_20);
  std::__cxx11::string::string((string *)&this->key);
  std::__cxx11::string::string((string *)&this->value);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->eol,"\n",local_2d);
  std::allocator<char>::~allocator(local_2d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->keySeparator,"::",&local_2e);
  std::allocator<char>::~allocator(&local_2e);
  return;
}

Assistant:

OutputFile::OutputFile(const string & name_arg, const string & version_arg)
  : name(name_arg), version(version_arg), eol("\n"), keySeparator("::") {}